

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_noise_model_init(aom_noise_model_t *model,aom_noise_model_params_t params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int (*paiVar4) [2];
  int iVar5;
  aom_noise_state_t *state;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  bool bVar12;
  uint local_3c;
  
  uVar8 = params._0_8_;
  bVar11 = params.shape;
  uVar9 = params.lag;
  if (bVar11 == 1) {
    iVar2 = uVar9 * 2 + 1;
    local_3c = (uint)(iVar2 * iVar2) >> 1;
  }
  else {
    local_3c = 0;
    if (((undefined1  [16])params & (undefined1  [16])0xff) == (undefined1  [16])0x0) {
      local_3c = (uVar9 + 1) * uVar9;
    }
  }
  iVar2 = 0;
  memset(model,0,0x2c0);
  if (uVar9 == 0 || (long)uVar8 < 0) {
    fprintf(_stderr,"Invalid noise param: lag = %d must be >= 1\n",uVar8 >> 0x20);
  }
  else if ((int)uVar9 < 5) {
    uVar6 = params.bit_depth;
    iVar2 = 0;
    if ((uVar6 < 0xd) && (iVar2 = 0, (0x1500U >> (uVar6 & 0x1f) & 1) != 0)) {
      (model->params).shape = (char)uVar8;
      *(int3 *)&(model->params).field_0x1 = (int3)(uVar8 >> 8);
      (model->params).lag = (int)(uVar8 >> 0x20);
      (model->params).bit_depth = (int)params._8_8_;
      (model->params).use_highbd = (int)((ulong)params._8_8_ >> 0x20);
      state = model->latest_state;
      uVar8 = 0;
      do {
        iVar10 = (local_3c + 1) - (uint)(uVar8 == 0);
        iVar2 = noise_state_init(state + -3,iVar10,uVar6);
        if ((iVar2 == 0) || (iVar2 = noise_state_init(state,iVar10,uVar6), iVar2 == 0)) {
          fprintf(_stderr,"Failed to allocate noise state for channel %d\n",uVar8 & 0xffffffff);
          aom_noise_model_free(model);
          return 0;
        }
        uVar8 = uVar8 + 1;
        state = state + 1;
      } while (uVar8 != 3);
      model->n = local_3c;
      paiVar4 = (int (*) [2])aom_malloc((long)(int)local_3c << 3);
      model->coords = paiVar4;
      if (paiVar4 == (int (*) [2])0x0) {
        aom_noise_model_free(model);
LAB_0029ff0d:
        iVar2 = 0;
      }
      else {
        iVar3 = -uVar9;
        iVar5 = 0;
        iVar2 = iVar3;
        iVar10 = 0;
        if ((int)uVar9 < 0) {
          iVar10 = iVar3;
        }
        do {
          uVar6 = -(uint)(iVar2 == 0) | uVar9;
          if (SBORROW4(uVar6,iVar3) == (int)(uVar6 + uVar9) < 0) {
            if (1 < bVar11) {
              aom_noise_model_init_cold_1();
              goto LAB_0029ff0d;
            }
            iVar7 = iVar3;
            do {
              iVar1 = -iVar7;
              if (0 < iVar7) {
                iVar1 = iVar7;
              }
              if ((bVar11 != 0) || (iVar1 <= (int)(iVar2 + uVar9))) {
                paiVar4 = model->coords;
                paiVar4[iVar5][0] = iVar7;
                paiVar4[iVar5][1] = iVar2;
                iVar5 = iVar5 + 1;
              }
              iVar7 = iVar7 + 1;
            } while (uVar6 + 1 != iVar7);
          }
          bVar12 = iVar2 != iVar10;
          iVar2 = iVar2 + 1;
        } while (bVar12);
        iVar2 = 1;
      }
    }
  }
  else {
    iVar2 = 0;
    fprintf(_stderr,"Invalid noise param: lag = %d must be <= %d\n",uVar8 >> 0x20,4);
  }
  return iVar2;
}

Assistant:

int aom_noise_model_init(aom_noise_model_t *model,
                         const aom_noise_model_params_t params) {
  const int n = num_coeffs(params);
  const int lag = params.lag;
  const int bit_depth = params.bit_depth;
  int x = 0, y = 0, i = 0, c = 0;

  memset(model, 0, sizeof(*model));
  if (params.lag < 1) {
    fprintf(stderr, "Invalid noise param: lag = %d must be >= 1\n", params.lag);
    return 0;
  }
  if (params.lag > kMaxLag) {
    fprintf(stderr, "Invalid noise param: lag = %d must be <= %d\n", params.lag,
            kMaxLag);
    return 0;
  }
  if (!(params.bit_depth == 8 || params.bit_depth == 10 ||
        params.bit_depth == 12)) {
    return 0;
  }

  memcpy(&model->params, &params, sizeof(params));
  for (c = 0; c < 3; ++c) {
    if (!noise_state_init(&model->combined_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
    if (!noise_state_init(&model->latest_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
  }
  model->n = n;
  model->coords = (int(*)[2])aom_malloc(sizeof(*model->coords) * n);
  if (!model->coords) {
    aom_noise_model_free(model);
    return 0;
  }

  for (y = -lag; y <= 0; ++y) {
    const int max_x = y == 0 ? -1 : lag;
    for (x = -lag; x <= max_x; ++x) {
      switch (params.shape) {
        case AOM_NOISE_SHAPE_DIAMOND:
          if (abs(x) <= y + lag) {
            model->coords[i][0] = x;
            model->coords[i][1] = y;
            ++i;
          }
          break;
        case AOM_NOISE_SHAPE_SQUARE:
          model->coords[i][0] = x;
          model->coords[i][1] = y;
          ++i;
          break;
        default:
          fprintf(stderr, "Invalid shape\n");
          aom_noise_model_free(model);
          return 0;
      }
    }
  }
  assert(i == n);
  return 1;
}